

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_doing(connectdata *conn,_Bool *dophase_done)

{
  Curl_easy *data;
  int iVar1;
  curltime cVar2;
  curltime now;
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  local_1c = tftp_multi_statemach(conn,dophase_done);
  if (((*dophase_done & 1U) == 0) && (local_1c == CURLE_OK)) {
    iVar1 = Curl_pgrsUpdate(conn);
    if (iVar1 == 0) {
      data = conn->data;
      cVar2 = Curl_now();
      now._12_4_ = 0;
      now.tv_sec = SUB128(cVar2._0_12_,0);
      now.tv_usec = SUB124(cVar2._0_12_,8);
      local_1c = Curl_speedcheck(data,now);
    }
    else {
      local_1c = CURLE_ABORTED_BY_CALLBACK;
    }
  }
  return local_1c;
}

Assistant:

static CURLcode tftp_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result;
  result = tftp_multi_statemach(conn, dophase_done);

  if(*dophase_done) {
    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }
  else if(!result) {
    /* The multi code doesn't have this logic for the DOING state so we
       provide it for TFTP since it may do the entire transfer in this
       state. */
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(conn->data, Curl_now());
  }
  return result;
}